

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator+=(TPZFMatrix<Fad<float>_> *this,Fad<float> *value)

{
  Fad<float> *this_00;
  Fad<float> *pFVar1;
  
  this_00 = this->fElem;
  pFVar1 = this_00 + (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol *
                     (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
  for (; this_00 < pFVar1; this_00 = this_00 + 1) {
    Fad<float>::operator+=<float,_nullptr>(this_00,value);
  }
  return this;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator+=(const TVar value ) {
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    
    TVar * dst = fElem, *dstlast = dst+size;
    while ( dst < dstlast ) *dst++ += value;
    return( *this );
}